

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O0

int get_signed_attribute(stack_st_X509_ATTRIBUTE *attribs,int nid,int type,char **buffer)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  void *__src;
  ASN1_TYPE *pAStack_38;
  int len;
  ASN1_TYPE *asn1_type;
  char **ppcStack_28;
  int rc;
  char **buffer_local;
  int type_local;
  int nid_local;
  stack_st_X509_ATTRIBUTE *attribs_local;
  
  ppcStack_28 = buffer;
  buffer_local._0_4_ = type;
  buffer_local._4_4_ = nid;
  _type_local = attribs;
  asn1_type._4_4_ = get_attribute(attribs,nid,(ASN1_TYPE **)&stack0xffffffffffffffc8);
  if (asn1_type._4_4_ == 1) {
    if (v_flag != 0) {
      fprintf(_stderr,"%s: error finding attribute\n",pname);
    }
    attribs_local._4_4_ = 1;
  }
  else {
    iVar1 = ASN1_TYPE_get(pAStack_38);
    if (iVar1 != (int)buffer_local) {
      fprintf(_stderr,"%s: wrong ASN.1 type\n",pname);
      exit(0x61);
    }
    uVar2 = ASN1_STRING_length((pAStack_38->value).asn1_string);
    if ((int)uVar2 < 1) {
      attribs_local._4_4_ = 1;
    }
    else {
      if (d_flag != 0) {
        printf("%s: allocating %d bytes for attribute\n",pname,(ulong)uVar2);
      }
      if ((int)buffer_local == 0x13) {
        pcVar3 = (char *)malloc((long)(int)(uVar2 + 1));
        *ppcStack_28 = pcVar3;
      }
      else {
        pcVar3 = (char *)malloc((long)(int)uVar2);
        *ppcStack_28 = pcVar3;
      }
      if (*ppcStack_28 == (char *)0x0) {
        fprintf(_stderr,"%s: cannot malloc space for attribute\n",pname);
        exit(0x61);
      }
      pcVar3 = *ppcStack_28;
      __src = (void *)ASN1_STRING_get0_data((pAStack_38->value).ptr);
      memcpy(pcVar3,__src,(long)(int)uVar2);
      if ((int)buffer_local == 0x13) {
        (*ppcStack_28)[(int)uVar2] = '\0';
      }
      attribs_local._4_4_ = 0;
    }
  }
  return attribs_local._4_4_;
}

Assistant:

int get_signed_attribute(STACK_OF(X509_ATTRIBUTE) *attribs, int nid,int type, char **buffer){
	int		rc;
	ASN1_TYPE	*asn1_type;
	int		len;

	/* Find attribute */
	rc = get_attribute(attribs, nid, &asn1_type);
	if (rc == 1) {
		if (v_flag)
			fprintf(stderr, "%s: error finding attribute\n",pname);
		return (1);
	}
	if (ASN1_TYPE_get(asn1_type) != type) {
		fprintf(stderr, "%s: wrong ASN.1 type\n",pname);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Copy data */
	len = ASN1_STRING_length(asn1_type->value.asn1_string);
	if (len <= 0) {
		return (1);
	} else if (d_flag)
		printf("%s: allocating %d bytes for attribute\n", pname, len);
	if (type == V_ASN1_PRINTABLESTRING) {
		*buffer = (char *)malloc(len + 1);
	} else {
		*buffer = (char *)malloc(len);
	}
	if (*buffer == NULL) {
		fprintf(stderr, "%s: cannot malloc space for attribute\n",
			pname);
		exit (SCEP_PKISTATUS_P7);
	}
/* for compatibility with older openssl versions
   from: https://wiki.openssl.org/index.php/OpenSSL_1.1.0_Changes

*/
#if OPENSSL_VERSION_NUMBER < 0x10100000L
	memcpy(*buffer, ASN1_STRING_data(asn1_type->value.asn1_string), len);
#else
	memcpy(*buffer, ASN1_STRING_get0_data(asn1_type->value.asn1_string), len);
#endif

	/* Add null terminator if it's a PrintableString */
	if (type == V_ASN1_PRINTABLESTRING) {
		(*buffer)[len] = 0;
		len++;
	}

	return (0);
}